

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void unroll(lua_State *L,void *ud)

{
  CallInfo *ci;
  ushort uVar1;
  int iVar2;
  StkId oldtop;
  CallInfo *pCVar3;
  uint uVar4;
  uint uVar5;
  
  while (ci = L->ci, ci != &L->base_ci) {
    uVar1 = ci->callstatus;
    if ((uVar1 & 2) == 0) {
      luaV_finishOp(L);
      luaV_execute(L,ci);
    }
    else {
      if ((uVar1 >> 9 & 1) == 0) {
        uVar4 = 1;
        pCVar3 = ci;
        uVar5 = 1;
        if ((uVar1 & 0x10) != 0) {
          uVar5 = uVar1 >> 10 & 7;
          if ((uVar1 >> 10 & 7) != 0) {
            iVar2 = (ci->u2).funcidx;
            L->allowhook = (byte)uVar1 & 1;
            oldtop = luaF_close(L,(StkId)((long)iVar2 + (long)(L->stack).p),uVar5,1);
            luaD_seterrorobj(L,uVar5,oldtop);
            luaD_shrinkstack(L);
            uVar1 = ci->callstatus & 0xe3ff;
            pCVar3 = L->ci;
            uVar4 = uVar5;
          }
          ci->callstatus = uVar1 & 0xffef;
          L->errfunc = (ci->u).c.old_errfunc;
          uVar5 = uVar4;
        }
        if ((pCVar3->top).p < (L->top).p) {
          (pCVar3->top).p = (L->top).p;
        }
        iVar2 = (*(ci->u).c.k)(L,uVar5,(ci->u).c.ctx);
      }
      else {
        iVar2 = (ci->u2).funcidx;
      }
      luaD_poscall(L,ci,iVar2);
    }
  }
  return;
}

Assistant:

static void unroll (lua_State *L, void *ud) {
  CallInfo *ci;
  UNUSED(ud);
  while ((ci = L->ci) != &L->base_ci) {  /* something in the stack */
    if (!isLua(ci))  /* C function? */
      finishCcall(L, ci);  /* complete its execution */
    else {  /* Lua function */
      luaV_finishOp(L);  /* finish interrupted instruction */
      luaV_execute(L, ci);  /* execute down to higher C 'boundary' */
    }
  }
}